

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# litl_split.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  
  if (1 < argc) {
    iVar4 = 1;
    do {
      pcVar2 = argv[iVar4];
      iVar3 = iVar4;
      if (*pcVar2 == '-') {
        if (pcVar2[1] == 'd') {
          cVar1 = pcVar2[2];
          ppcVar5 = &__output_dir;
joined_r0x00101215:
          if (cVar1 == '\0') {
            iVar3 = iVar4 + 1;
            *ppcVar5 = argv[(long)iVar4 + 1];
            goto LAB_00101223;
          }
        }
        else if (pcVar2[1] == 'f') {
          cVar1 = pcVar2[2];
          ppcVar5 = &__archive_name;
          goto joined_r0x00101215;
        }
        main_cold_1();
        goto LAB_00101257;
      }
LAB_00101223:
      iVar4 = iVar3 + 1;
    } while (iVar4 < argc);
  }
  if ((*__archive_name != '\0') && (*__output_dir != '\0')) {
    litl_split_archive(__archive_name,__output_dir);
    return 0;
  }
LAB_00101257:
  __usage((int)*argv,argv);
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {

  // parse the arguments passed to this program
  __parse_args(argc, argv);

  // split the archive
  litl_split_archive(__archive_name, __output_dir);

  return EXIT_SUCCESS;
}